

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRefactor.c
# Opt level: O3

void Abc_NtkManRefStop(Abc_ManRef_t *p)

{
  Vec_Ptr_t *pVVar1;
  void **ppvVar2;
  Vec_Int_t *__ptr;
  int *__ptr_00;
  Vec_Str_t *__ptr_01;
  char *__ptr_02;
  int iVar3;
  long lVar4;
  
  pVVar1 = p->vFuncs;
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    iVar3 = pVVar1->nSize;
    if (0 < iVar3) {
      lVar4 = 0;
      do {
        if ((void *)0x2 < pVVar1->pArray[lVar4]) {
          free(pVVar1->pArray[lVar4]);
          iVar3 = pVVar1->nSize;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < iVar3);
    }
    if (pVVar1->pArray != (void **)0x0) {
      free(pVVar1->pArray);
    }
    free(pVVar1);
  }
  pVVar1 = p->vVars;
  ppvVar2 = pVVar1->pArray;
  if (ppvVar2 != (void **)0x0) {
    free(ppvVar2);
  }
  free(pVVar1);
  __ptr = p->vMemory;
  __ptr_00 = __ptr->pArray;
  if (__ptr_00 != (int *)0x0) {
    free(__ptr_00);
  }
  free(__ptr);
  pVVar1 = p->vVisited;
  ppvVar2 = pVVar1->pArray;
  if (ppvVar2 != (void **)0x0) {
    free(ppvVar2);
  }
  free(pVVar1);
  __ptr_01 = p->vCube;
  __ptr_02 = __ptr_01->pArray;
  if (__ptr_02 != (char *)0x0) {
    free(__ptr_02);
  }
  free(__ptr_01);
  free(p);
  return;
}

Assistant:

void Abc_NtkManRefStop( Abc_ManRef_t * p )
{
    Vec_PtrFreeFree( p->vFuncs );
    Vec_PtrFree( p->vVars );
    Vec_IntFree( p->vMemory );
    Vec_PtrFree( p->vVisited );
    Vec_StrFree( p->vCube );
    ABC_FREE( p );
}